

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_2,_4>::Matrix(Matrix<float,_2,_4> *this)

{
  int row;
  long lVar1;
  int col;
  long lVar2;
  undefined4 uVar3;
  
  Vector<tcu::Vector<float,_2>,_4>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar3 = 0x3f800000;
      if (lVar1 != lVar2) {
        uVar3 = 0;
      }
      *(undefined4 *)((long)this + lVar2 * 2 * 4) = uVar3;
    }
    this = (Matrix<float,_2,_4> *)((long)this + 4);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}